

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

void __thiscall
testing::internal::linked_ptr<const_testing::MatcherInterface<unsigned_long>_>::linked_ptr
          (linked_ptr<const_testing::MatcherInterface<unsigned_long>_> *this,
          linked_ptr<const_testing::MatcherInterface<unsigned_long>_> *ptr)

{
  MatcherInterface<unsigned_long> *pMVar1;
  linked_ptr_internal *this_00;
  
  if (ptr == this) {
    __assert_fail("&ptr != this",
                  "/workspace/llm4binary/github/license_c_cmakelists/CppCodeReviewers[P]How-to-mock-free-function/3rd-party/gmock-1.7.0/gtest/gtest.h"
                  ,0x2394,
                  "testing::internal::linked_ptr<const testing::MatcherInterface<unsigned long>>::linked_ptr(const linked_ptr<T> &) [T = const testing::MatcherInterface<unsigned long>]"
                 );
  }
  pMVar1 = ptr->value_;
  this->value_ = pMVar1;
  this_00 = &this->link_;
  if (pMVar1 != (MatcherInterface<unsigned_long> *)0x0) {
    linked_ptr_internal::join(this_00,&ptr->link_);
    return;
  }
  this_00->next_ = this_00;
  return;
}

Assistant:

linked_ptr(linked_ptr const& ptr) {  // NOLINT
    assert(&ptr != this);
    copy(&ptr);
  }